

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagPrinterFancyCore.cpp
# Opt level: O2

void __thiscall
Mond::DiagPrinterFancyCore::PrintSev(DiagPrinterFancyCore *this,Diag *d,char *fmt,...)

{
  char *pcVar1;
  char local_4e8 [8];
  char buffer [1024];
  undefined8 local_38;
  va_list ap;
  
  ap[0].overflow_arg_area = buffer + 0x3f8;
  ap[0]._0_8_ = &stack0x00000008;
  local_38 = 0x3000000018;
  vsnprintf(local_4e8,0x400,fmt,&local_38);
  putchar(0x5b);
  (**this->_vptr_DiagPrinterFancyCore)(this,(ulong)d->severity);
  pcVar1 = GetSeverityName(d->severity);
  printf("%s",pcVar1);
  (*this->_vptr_DiagPrinterFancyCore[1])(this);
  printf("] %s",local_4e8);
  return;
}

Assistant:

void DiagPrinterFancyCore::PrintSev(const Diag &d, const char *fmt, ...)
{
	char buffer[1024];

	va_list ap;
	va_start(ap, fmt);
	vsnprintf(buffer, 1024, fmt, ap);
	va_end(ap);

	printf("[");

	SetColor(d.severity);
	printf("%s", GetSeverityName(d.severity));
	ResetColor();

	printf("] %s", buffer);
}